

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v10::detail::bigint::multiply(bigint *this,uint32_t value)

{
  size_t sVar1;
  uint *puVar2;
  long lVar3;
  uint in_ESI;
  buffer<unsigned_int> *in_RDI;
  double_bigit result;
  size_t n;
  size_t i;
  bigit carry;
  double_bigit wide_value;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined8 local_28;
  undefined4 local_1c;
  
  local_1c = 0;
  local_28 = 0;
  sVar1 = buffer<unsigned_int>::size(in_RDI);
  for (; local_28 < sVar1; local_28 = local_28 + 1) {
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>(in_RDI,local_28);
    lVar3 = (ulong)*puVar2 * (ulong)in_ESI + (ulong)local_1c;
    in_stack_ffffffffffffffbc = (uint)lVar3;
    puVar2 = buffer<unsigned_int>::operator[]<unsigned_long>(in_RDI,local_28);
    *puVar2 = in_stack_ffffffffffffffbc;
    local_1c = (uint)((ulong)lVar3 >> 0x20);
  }
  if (local_1c != 0) {
    buffer<unsigned_int>::push_back
              (in_RDI,(uint *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void multiply(uint32_t value) {
    const double_bigit wide_value = value;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * wide_value + carry;
      bigits_[i] = static_cast<bigit>(result);
      carry = static_cast<bigit>(result >> bigit_bits);
    }
    if (carry != 0) bigits_.push_back(carry);
  }